

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storing.c
# Opt level: O2

int store_all_transfers_db(FILE *fp,feed_db_t *db)

{
  int iVar1;
  uint fields_number;
  feed_db_status_t fVar2;
  int iVar3;
  size_t sz;
  int iVar4;
  char **field_names;
  feed_db_t *local_c8;
  char **record_values;
  transfer_t record;
  
  record_values = (char **)0x0;
  local_c8 = db;
  iVar1 = count_lines(fp);
  field_names = (char **)0x0;
  fields_number = read_header(fp,&field_names);
  if ((int)fields_number < 0) {
    sz = (size_t)(int)fields_number;
  }
  else {
    if (iVar1 < 2) {
      free_cstr_arr(field_names,(ulong)fields_number);
      return -(uint)(iVar1 != 1);
    }
    fVar2 = begin_transaction_db(local_c8);
    if (fVar2 != FEED_DB_ERROR) {
      iVar4 = 0;
      while (iVar1 = iVar1 + -1, iVar1 != 0) {
        iVar3 = read_record(fp,fields_number,&record_values);
        if (0 < iVar3) {
          read_transfer(&record,fields_number,field_names,record_values);
          fVar2 = store_transfer_db(&record,local_c8);
          if (fVar2 != FEED_DB_SUCCESS) break;
          iVar4 = iVar4 + 1;
        }
        free_cstr_arr(record_values,(ulong)fields_number);
      }
      end_transaction_db(local_c8);
      free_cstr_arr(field_names,(ulong)fields_number);
      return iVar4;
    }
    sz = (size_t)fields_number;
  }
  free_cstr_arr(field_names,sz);
  return -1;
}

Assistant:

int store_all_transfers_db(FILE *fp, feed_db_t *db) {

    transfer_t record;
    feed_db_status_t res;

    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }

    if (lines_count < 1) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return (lines_count < 0) ? -1 : 0;
    }

    #ifndef CGTFS_STORING_BATCH_TRANSACTIONS_OFF
    if ((res = begin_transaction_db(db)) == FEED_DB_ERROR) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }
    #endif

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            read_transfer(&record, field_count, (const char **)field_names, (const char **)record_values);
            res = store_transfer_db(&record, db);

            // free_cstr_arr(record_values, field_count);

            if (res == FEED_DB_SUCCESS)
                record_count++;
            else
                break;
        }
        free_cstr_arr(record_values, field_count);
    }

    #ifndef CGTFS_STORING_BATCH_TRANSACTIONS_OFF
    end_transaction_db(db);
    #endif

    free_cstr_arr(field_names, field_count);
    return record_count;
}